

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::showChildren(QWidgetPrivate *this,bool spontaneous)

{
  uint *puVar1;
  ulong uVar2;
  QWidget *this_00;
  QWidgetPrivate *this_01;
  QDebug *pQVar3;
  QWindow *pQVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  WidgetAttributes local_a8;
  QDebug local_a0;
  undefined1 local_98 [8];
  QDebug local_90;
  anon_unknown_dwarf_27bb4f local_88 [8];
  QArrayDataPointer<QObject_*> local_80;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 local_54;
  char *local_50;
  QDebug local_48;
  Stream *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_68 = 2;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_50 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_48,"Showing children of");
    local_40 = pQVar3->stream;
    *(int *)(local_40 + 0x28) = *(int *)(local_40 + 0x28) + 1;
    ::operator<<((Stream *)&local_80,(QWidget *)&local_40);
    pQVar3 = QDebug::operator<<((QDebug *)&local_80,"spontaneously");
    QDebug::operator<<(pQVar3,spontaneous);
    QDebug::~QDebug((QDebug *)&local_80);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug(&local_48);
  }
  local_80.d = *(Data **)&this->field_0x18;
  local_80.ptr = *(QObject ***)&this->field_0x20;
  uVar2 = *(ulong *)&this->field_0x28;
  if (local_80.d != (Data *)0x0) {
    LOCK();
    ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_80.size = uVar2;
  for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    this_00 = (QWidget *)((WId *)local_80.ptr)[uVar5];
    if ((this_00 != (QWidget *)0x0) && ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) != 0))
    {
      QtPrivateLogging::lcWidgetShowHide();
      if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
                 _M_base._M_i & 1) != 0) {
        local_68 = 2;
        uStack_64 = 0;
        uStack_60 = 0;
        uStack_5c = 0;
        uStack_58 = 0;
        local_54 = 0;
        local_50 = QtPrivateLogging::lcWidgetShowHide::category.name;
        QMessageLogger::debug();
        pQVar3 = QDebug::operator<<(&local_a0,"Considering");
        local_98 = (undefined1  [8])pQVar3->stream;
        *(int *)((long)local_98 + 0x28) = *(int *)((long)local_98 + 0x28) + 1;
        ::operator<<((Stream *)&local_48,(QWidget *)local_98);
        pQVar3 = QDebug::operator<<(&local_48,"with attributes");
        local_90.stream = pQVar3->stream;
        *(int *)(local_90.stream + 0x28) = *(int *)(local_90.stream + 0x28) + 1;
        local_a8.widget = this_00;
        anon_unknown.dwarf_27bb4f::operator<<(local_88,&local_90,&local_a8);
        QDebug::~QDebug((QDebug *)local_88);
        QDebug::~QDebug(&local_90);
        QDebug::~QDebug(&local_48);
        QDebug::~QDebug((QDebug *)local_98);
        QDebug::~QDebug(&local_a0);
      }
      pQVar4 = QWidget::windowHandle(this_00);
      if ((pQVar4 != (QWindow *)0x0) &&
         ((*(byte *)(*(long *)&this_00->field_0x8 + 0x244) & 0x20) == 0)) {
        QWidget::setAttribute(this_00,WA_WState_Hidden,false);
      }
      if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
         ((this_00->data->widget_attributes & 0x10000) == 0)) {
        if (spontaneous) {
          QWidget::setAttribute(this_00,WA_Mapped,true);
          showChildren(*(QWidgetPrivate **)&this_00->field_0x8,true);
          local_68 = 0xaaaaaaaa;
          uStack_64 = 0xaaaaaaaa;
          uStack_60 = 0xaaaaaaaa;
          uStack_5c = 0xaaaaaaaa;
          QShowEvent::QShowEvent((QShowEvent *)&local_68);
          QCoreApplication::sendSpontaneousEvent((QObject *)this_00,(QEvent *)&local_68);
          QShowEvent::~QShowEvent((QShowEvent *)&local_68);
        }
        else {
          this_01 = *(QWidgetPrivate **)&this_00->field_0x8;
          if ((this_01->high_attributes[1] & 0x20) == 0) {
            this_01->field_0x253 = this_01->field_0x253 | 0x80;
            (**(code **)(*(long *)this_00 + 0x68))(this_00,1);
            puVar1 = (uint *)(*(long *)&this_00->field_0x8 + 0x250);
            *puVar1 = *puVar1 & 0x7fffffff;
          }
          else {
            show_recursive(this_01);
          }
        }
      }
    }
  }
  QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::showChildren(bool spontaneous)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Showing children of" << q
                              << "spontaneously" << spontaneous;

    QList<QObject*> childList = children;
    for (int i = 0; i < childList.size(); ++i) {
        QWidget *widget = qobject_cast<QWidget*>(childList.at(i));
        if (!widget)
            continue;
        qCDebug(lcWidgetShowHide) << "Considering" << widget
              << "with attributes" << WidgetAttributes{widget};
        if (widget->windowHandle() && !widget->testAttribute(Qt::WA_WState_ExplicitShowHide))
            widget->setAttribute(Qt::WA_WState_Hidden, false);
        if (widget->isWindow() || widget->testAttribute(Qt::WA_WState_Hidden))
            continue;
        if (spontaneous) {
            widget->setAttribute(Qt::WA_Mapped);
            widget->d_func()->showChildren(true);
            QShowEvent e;
            QApplication::sendSpontaneousEvent(widget, &e);
        } else {
            if (widget->testAttribute(Qt::WA_WState_ExplicitShowHide)) {
                widget->d_func()->show_recursive();
            } else {
                // Call QWidget::setVisible() here, so that subclasses
                // that (wrongly) override setVisible to do initialization
                // will still be notified that they are made visible, but
                // do so without triggering ExplicitShowHide.
                widget->d_func()->dontSetExplicitShowHide = true;
                widget->setVisible(true);
                widget->d_func()->dontSetExplicitShowHide = false;
            }
        }
    }
}